

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tm.c
# Opt level: O1

bool_t tmDateIsValid2(octet *date)

{
  bool_t bVar1;
  
  bVar1 = memIsValid(date,6);
  if (bVar1 != 0) {
    bVar1 = tmDateIsValid((ulong)date[1] + (ulong)*date * 10 + 2000,
                          (ulong)date[3] + (ulong)date[2] * 10,(ulong)date[5] + (ulong)date[4] * 10)
    ;
    return bVar1;
  }
  return 0;
}

Assistant:

bool_t tmDateIsValid2(const octet date[6])
{
	return memIsValid(date, 6) && 
		tmDateIsValid(
			(size_t)10 * date[0] + date[1] + 2000,
			(size_t)10 * date[2] + date[3],
			(size_t)10 * date[4] + date[5]);
}